

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeProxyConstructor
               (DynamicObject *proxyConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  PropertyString *pPVar1;
  RuntimeFunction *pRVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,proxyConstructor,mode,4,0);
  this = (((proxyConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(proxyConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(proxyConstructor,0xd1,&DAT_1000000000002,2,0,0,0);
  pPVar1 = ScriptContext::GetPropertyString(this_00,0x126);
  (*(proxyConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(proxyConstructor,0x106,pPVar1,2,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptProxy::EntryInfo::Revocable,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x137);
  (*(proxyConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(proxyConstructor,0x137,pRVar2,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(proxyConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeProxyConstructor(DynamicObject* proxyConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(proxyConstructor, mode, 4);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSymbol
        // so that the update is in sync with profiler
        JavascriptLibrary* library = proxyConstructor->GetLibrary();
        ScriptContext* scriptContext = proxyConstructor->GetScriptContext();
        library->AddMember(proxyConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(2), PropertyConfigurable);
        library->AddMember(proxyConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Proxy), PropertyConfigurable);

        library->AddFunctionToLibraryObject(proxyConstructor, PropertyIds::revocable, &JavascriptProxy::EntryInfo::Revocable, 2, PropertyConfigurable);

        proxyConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }